

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::SamplesMissMatchTest::SamplesMissMatchTest
          (SamplesMissMatchTest *this,Context *context)

{
  int iVar1;
  int iVar2;
  GLenum GVar3;
  long lVar4;
  GLenum GVar5;
  value_type local_64;
  SamplesMissMatchTest *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"samples_missmatch",
             "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData have different number of samples"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SamplesMissMatchTest_01dbcd20;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = this;
  for (local_48 = 0; local_48 != 2; local_48 = local_48 + 1) {
    iVar1 = SamplesMissMatchTest::n_samples[local_48];
    for (local_40 = 0; local_40 != 2; local_40 = local_40 + 1) {
      iVar2 = SamplesMissMatchTest::n_samples[local_40];
      GVar5 = 0x502;
      if (iVar1 == iVar2) {
        GVar5 = 0;
      }
      for (local_38 = 0; local_38 != 2; local_38 = local_38 + 1) {
        GVar3 = SamplesMissMatchTest::targets[local_38];
        for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 4) {
          local_64.m_dst_target = *(GLenum *)((long)SamplesMissMatchTest::targets + lVar4);
          local_64.m_src_target = GVar3;
          local_64.m_src_n_samples = iVar1;
          local_64.m_dst_n_samples = iVar2;
          local_64.m_expected_result = GVar5;
          std::
          vector<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
          ::push_back(&this->m_test_cases,&local_64);
        }
      }
    }
  }
  return;
}

Assistant:

SamplesMissMatchTest::SamplesMissMatchTest(deqp::Context& context)
	: TestCase(context, "samples_missmatch", "Test verifies if INVALID_OPERATION is generated when textures provided "
											 "to CopySubImageData have different number of samples")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	testCase test_case;

	static const GLsizei n_samples[2] = { 1, 4 };

	static const GLenum targets[2] = { GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY };

	for (GLuint src_sample = 0; src_sample < 2; ++src_sample)
	{
		for (GLuint dst_sample = 0; dst_sample < 2; ++dst_sample)
		{
			for (GLuint src_target = 0; src_target < 2; ++src_target)
			{
				for (GLuint dst_target = 0; dst_target < 2; ++dst_target)
				{
					test_case.m_src_target	= targets[src_target];
					test_case.m_src_n_samples = n_samples[src_sample];
					test_case.m_dst_target	= targets[dst_target];
					test_case.m_dst_n_samples = n_samples[dst_sample];

					if (test_case.m_src_n_samples == test_case.m_dst_n_samples)
					{
						test_case.m_expected_result = GL_NO_ERROR;
					}
					else
					{
						test_case.m_expected_result = GL_INVALID_OPERATION;
					}

					m_test_cases.push_back(test_case);
				}
			}
		}
	}
}